

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

void unknown_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  int c;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  byte *pbVar7;
  char buf [4];
  char local_34 [4];
  
  pbVar7 = (byte *)*fromP;
  pcVar6 = fromLim;
  do {
    if (pbVar7 == (byte *)fromLim) {
      return;
    }
    ppcVar4 = (char **)(ulong)*pbVar7;
    cVar1 = *(char *)((long)enc[6].literalScanners + (long)ppcVar4 * 4 + 0x68);
    uVar3 = (uint)cVar1;
    if (cVar1 == '\0') {
      c = (*enc[3].literalScanners[1])((ENCODING *)enc[3].sameName,(char *)pbVar7,pcVar6,ppcVar4);
      uVar3 = cm_expat_XmlUtf8Encode(c,local_34);
      if ((long)toLim - (long)*toP < (long)(ulong)uVar3) {
        return;
      }
      pbVar7 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3
                                 ));
      pcVar5 = local_34;
    }
    else {
      if ((long)toLim - (long)*toP < (long)(int)uVar3) {
        return;
      }
      pcVar5 = (char *)((long)enc[6].literalScanners + (long)ppcVar4 * 4 + 0x69);
      pbVar7 = pbVar7 + 1;
    }
    *fromP = (char *)pbVar7;
    pcVar6 = (char *)0x0;
    do {
      cVar1 = pcVar5[(long)pcVar6];
      pcVar2 = *toP;
      *toP = pcVar2 + 1;
      *pcVar2 = cVar1;
      pcVar6 = pcVar6 + 1;
    } while (uVar3 != (uint)pcVar6);
    pbVar7 = (byte *)*fromP;
  } while( true );
}

Assistant:

static
void unknown_toUtf8(const ENCODING *enc,
                    const char **fromP, const char *fromLim,
                    char **toP, const char *toLim)
{
  char buf[XML_UTF8_ENCODE_MAX];
  for (;;) {
    const char *utf8;
    int n;
    if (*fromP == fromLim)
      break;
    utf8 = ((const struct unknown_encoding *)enc)->utf8[(unsigned char)**fromP];
    n = *utf8++;
    if (n == 0) {
      int c = ((const struct unknown_encoding *)enc)
              ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      n = XmlUtf8Encode(c, buf);
      if (n > toLim - *toP)
        break;
      utf8 = buf;
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else {
      if (n > toLim - *toP)
        break;
      (*fromP)++;
    }
    do {
      *(*toP)++ = *utf8++;
    } while (--n != 0);
  }
}